

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5SeekCursor(Fts5Cursor *pCsr,int bErrormsg)

{
  sqlite3_stmt **ppStmt;
  sqlite3_vtab *psVar1;
  Fts5Storage *p;
  int iVar2;
  int iVar3;
  i64 *piVar4;
  char **pzErrMsg;
  ulong uVar5;
  
  ppStmt = &pCsr->pStmt;
  if (pCsr->pStmt == (sqlite3_stmt *)0x0) {
    psVar1 = (pCsr->base).pVtab;
    uVar5 = 2;
    if (pCsr->ePlan == 5) {
      uVar5 = (ulong)(pCsr->bDesc != 0);
    }
    p = (Fts5Storage *)psVar1[1].zErrMsg;
    pzErrMsg = (char **)0x0;
    if (bErrormsg != 0) {
      pzErrMsg = &psVar1->zErrMsg;
    }
    iVar2 = fts5StorageGetStmt(p,(int)uVar5,ppStmt,pzErrMsg);
    if (iVar2 != 0) {
      return iVar2;
    }
    p->aStmt[uVar5] = (sqlite3_stmt *)0x0;
  }
  iVar2 = 0;
  if ((pCsr->csrflags & 2) != 0) {
    sqlite3_reset(pCsr->pStmt);
    if (pCsr->pSorter == (Fts5Sorter *)0x0) {
      piVar4 = &pCsr->pExpr->pRoot->iRowid;
    }
    else {
      piVar4 = &pCsr->pSorter->iRowid;
    }
    sqlite3_bind_int64(pCsr->pStmt,1,*piVar4);
    iVar2 = sqlite3_step(*ppStmt);
    if (iVar2 == 100) {
      *(byte *)&pCsr->csrflags = (byte)pCsr->csrflags & 0xfd;
      iVar2 = 0;
    }
    else {
      iVar3 = sqlite3_reset(*ppStmt);
      iVar2 = 0x10b;
      if (iVar3 != 0) {
        iVar2 = iVar3;
      }
    }
  }
  return iVar2;
}

Assistant:

static int fts5SeekCursor(Fts5Cursor *pCsr, int bErrormsg){
  int rc = SQLITE_OK;

  /* If the cursor does not yet have a statement handle, obtain one now. */ 
  if( pCsr->pStmt==0 ){
    Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
    int eStmt = fts5StmtType(pCsr);
    rc = sqlite3Fts5StorageStmt(
        pTab->pStorage, eStmt, &pCsr->pStmt, (bErrormsg?&pTab->p.base.zErrMsg:0)
    );
    assert( rc!=SQLITE_OK || pTab->p.base.zErrMsg==0 );
    assert( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_CONTENT) );
  }

  if( rc==SQLITE_OK && CsrFlagTest(pCsr, FTS5CSR_REQUIRE_CONTENT) ){
    assert( pCsr->pExpr );
    sqlite3_reset(pCsr->pStmt);
    sqlite3_bind_int64(pCsr->pStmt, 1, fts5CursorRowid(pCsr));
    rc = sqlite3_step(pCsr->pStmt);
    if( rc==SQLITE_ROW ){
      rc = SQLITE_OK;
      CsrFlagClear(pCsr, FTS5CSR_REQUIRE_CONTENT);
    }else{
      rc = sqlite3_reset(pCsr->pStmt);
      if( rc==SQLITE_OK ){
        rc = FTS5_CORRUPT;
      }
    }
  }
  return rc;
}